

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QPostEvent>::emplace<QPostEvent_const&>
          (QMovableArrayOps<QPostEvent> *this,qsizetype i,QPostEvent *args)

{
  bool bVar1;
  qsizetype qVar2;
  QPostEvent *pQVar3;
  undefined8 *in_RDX;
  QPostEvent *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QPostEvent tmp;
  QPostEvent *in_stack_ffffffffffffff68;
  QArrayDataPointer<QPostEvent> *in_stack_ffffffffffffff70;
  Inserter *this_00;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar4;
  GrowthPosition in_stack_ffffffffffffff8c;
  QArrayDataPointer<QPostEvent> *in_stack_ffffffffffffff90;
  Inserter local_48;
  QObject *local_20;
  QEvent *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QPostEvent>::needsDetach(in_stack_ffffffffffffff70);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<QPostEvent>::freeSpaceAtEnd
                          ((QArrayDataPointer<QPostEvent> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       qVar2 != 0)) {
      pQVar3 = QArrayDataPointer<QPostEvent>::end(in_stack_ffffffffffffff70);
      pQVar3->receiver = (QObject *)*in_RDX;
      pQVar3->event = (QEvent *)in_RDX[1];
      *(undefined8 *)&pQVar3->priority = in_RDX[2];
      in_RDI->displaceTo = (QPostEvent *)((long)&in_RDI->displaceTo->receiver + 1);
      goto LAB_0055b1a3;
    }
    if ((in_RSI == (QPostEvent *)0x0) &&
       (qVar2 = QArrayDataPointer<QPostEvent>::freeSpaceAtBegin
                          ((QArrayDataPointer<QPostEvent> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       qVar2 != 0)) {
      pQVar3 = QArrayDataPointer<QPostEvent>::begin((QArrayDataPointer<QPostEvent> *)0x55b00b);
      pQVar3[-1].receiver = (QObject *)*in_RDX;
      pQVar3[-1].event = (QEvent *)in_RDX[1];
      *(undefined8 *)&pQVar3[-1].priority = in_RDX[2];
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QPostEvent *)((long)&in_RDI->displaceTo->receiver + 1);
      goto LAB_0055b1a3;
    }
  }
  local_20 = (QObject *)*in_RDX;
  local_18 = (QEvent *)in_RDX[1];
  local_10 = in_RDX[2];
  bVar1 = in_RDI->displaceTo != (QPostEvent *)0x0;
  uVar4 = bVar1 && in_RSI == (QPostEvent *)0x0;
  QArrayDataPointer<QPostEvent>::detachAndGrow
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(qsizetype)in_RDI,
             (QPostEvent **)CONCAT17(uVar4,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70);
  if (bVar1 && in_RSI == (QPostEvent *)0x0) {
    pQVar3 = QArrayDataPointer<QPostEvent>::begin((QArrayDataPointer<QPostEvent> *)0x55b107);
    pQVar3[-1].receiver = local_20;
    pQVar3[-1].event = local_18;
    *(undefined8 *)&pQVar3[-1].priority = local_10;
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QPostEvent *)((long)&in_RDI->displaceTo->receiver + 1);
  }
  else {
    this_00 = &local_48;
    Inserter::Inserter(in_RDI,(QArrayDataPointer<QPostEvent> *)
                              CONCAT17(uVar4,in_stack_ffffffffffffff78),(qsizetype)this_00,
                       (qsizetype)in_stack_ffffffffffffff68);
    Inserter::insertOne(this_00,in_stack_ffffffffffffff68);
    Inserter::~Inserter(&local_48);
  }
LAB_0055b1a3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }